

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

void Example_Init(void)

{
  int iVar1;
  ushort uVar2;
  Am_Wrapper *pAVar3;
  Am_Object *pAVar4;
  Am_Constraint *pAVar5;
  uint uVar6;
  Am_Object AVar7;
  Am_Object AVar8;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  
  uVar2 = Am_Register_Slot_Name("EXAMPLE_FEATURES");
  EXAMPLE_FEATURES = (int)uVar2;
  uVar2 = Am_Register_Slot_Name("EXAMPLE_STROKE");
  EXAMPLE_STROKE = (int)uVar2;
  uVar2 = Am_Register_Slot_Name("EXAMPLE_ARROW");
  EXAMPLE_ARROW = (int)uVar2;
  uVar2 = Am_Register_Slot_Name("EXAMPLE_SET_SCALING");
  EXAMPLE_SET_SCALING = (int)uVar2;
  Am_Object::Create((char *)&local_18);
  uVar2 = Am_Object::Set((ushort)&local_18,0x66,0x32);
  uVar2 = Am_Object::Set(uVar2,0x67,0x32);
  uVar2 = Am_Object::Add(uVar2,EXAMPLE_FEATURES & 0xffff,0);
  iVar1 = EXAMPLE_STROKE;
  Am_Object::Create((char *)&local_20);
  AVar7.data._0_4_ = iVar1 & 0xffff;
  AVar7.data._4_4_ = 0;
  uVar2 = Am_Object::Add_Part(uVar2,AVar7,(ulong)&local_20);
  uVar6 = EXAMPLE_ARROW & 0xffff;
  Am_Object::Create((char *)&local_30);
  pAVar3 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_30,(Am_Wrapper *)0x6b,(ulong)pAVar3);
  Am_Object::Am_Object(&local_28,pAVar4);
  AVar8.data._4_4_ = 0;
  AVar8.data._0_4_ = uVar6;
  uVar2 = Am_Object::Add_Part(uVar2,AVar8,(ulong)&local_28);
  iVar1 = EXAMPLE_SET_SCALING;
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)set_scaling);
  pAVar4 = (Am_Object *)Am_Object::Add(uVar2,(Am_Constraint *)(ulong)(iVar1 & 0xffff),(ulong)pAVar5)
  ;
  Am_Object::operator=(&Example,pAVar4);
  Am_Object::~Am_Object(&local_28);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

void
Example_Init()
{
  EXAMPLE_FEATURES = Am_Register_Slot_Name("EXAMPLE_FEATURES");
  EXAMPLE_STROKE = Am_Register_Slot_Name("EXAMPLE_STROKE");
  EXAMPLE_ARROW = Am_Register_Slot_Name("EXAMPLE_ARROW");
  EXAMPLE_SET_SCALING = Am_Register_Slot_Name("EXAMPLE_SET_SCALING");

  Example =
      Am_Group.Create("Example")
          .Set(Am_WIDTH, 50)
          .Set(Am_HEIGHT, 50)

          // model: the example feature vector
          .Add(EXAMPLE_FEATURES, 0)

          // view: a polyline tracing out the gesture, with a little red
          //       directional arrow at its starting point
          .Add_Part(EXAMPLE_STROKE, polyline.Create("Example_stroke"))
          .Add_Part(EXAMPLE_ARROW,
                    polyline.Create("Example_arrow").Set(Am_LINE_STYLE, Am_Red))

          .Add(EXAMPLE_SET_SCALING, set_scaling);
}